

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Validity * __thiscall
capnp::compiler::CompilerMain::addSourcePrefix
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr prefix)

{
  _func_int **in_RAX;
  StringPtr pathStr;
  GlobalErrorReporter local_18;
  
  pathStr.content.size_ = prefix.content.ptr;
  pathStr.content.ptr = (char *)this;
  local_18._vptr_GlobalErrorReporter = in_RAX;
  getSourceDirectory((CompilerMain *)&stack0xffffffffffffffe8,pathStr,prefix.content.size_._0_1_);
  if (local_18._vptr_GlobalErrorReporter == (_func_int **)0x0) {
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,"no such directory");
  }
  else {
    (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addSourcePrefix(kj::StringPtr prefix) {
    if (getSourceDirectory(prefix, true) == kj::none) {
      return "no such directory";
    } else {
      return true;
    }
  }